

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::Company(Company *this,int budget,Boss *boss,Employee **array)

{
  uint uVar1;
  int iVar2;
  Boss *this_00;
  Employee **ppEVar3;
  Employee *this_01;
  ulong uVar4;
  long lVar5;
  
  this->_vptr_Company = (_func_int **)&PTR__Company_00109d90;
  this->boss = (Boss *)0x0;
  this->budget = budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,boss);
  this->boss = this_00;
  uVar1 = Boss::getNumberOfEmployees(boss);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = (ulong)uVar1 << 3;
  }
  ppEVar3 = (Employee **)operator_new__(uVar4);
  this->employeeArray = ppEVar3;
  lVar5 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(boss);
    if (iVar2 <= lVar5) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,array[lVar5]);
    this->employeeArray[lVar5] = this_01;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

Company::Company(int budget, Boss *boss, Employee **array) {
    this->budget = budget;
    this->boss = new Boss(*boss);
    employeeArray = new Employee *[boss->getNumberOfEmployees()];
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        employeeArray[i] = new Employee(*array[i]);
    }

}